

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O3

uint id3_fill_comment(uchar *buf,uint len,uchar encoding,char *short_comment,char *long_comment,
                     char *language)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  char *pcVar8;
  uchar *__dest;
  uchar *__dest_00;
  
  if (buf == (uchar *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x22,
                  "unsigned int id3_fill_comment(unsigned char *, unsigned int, unsigned char, char *, char *, char *)"
                 );
  }
  if (len != 0) {
    if (short_comment != (char *)0x0 || long_comment != (char *)0x0) {
      pcVar8 = "eng";
      if (language != (char *)0x0) {
        pcVar8 = language;
      }
      sVar6 = 0;
      if (short_comment != (char *)0x0) {
        sVar6 = strlen(short_comment);
      }
      sVar1 = 0;
      if (long_comment != (char *)0x0) {
        sVar1 = strlen(long_comment);
      }
      uVar7 = (int)sVar6 + (int)sVar1 + 0xc;
      if (uVar7 <= len) {
        uVar2 = (ulong)((int)sVar6 + (int)sVar1 + 6);
        buf[2] = 'M';
        buf[0] = 'C';
        buf[1] = 'O';
        lVar3 = 0;
        uVar4 = 0;
        uVar5 = uVar2;
        do {
          uVar4 = uVar4 | (ulong)((uint)uVar5 & 0x7f) << ((byte)lVar3 & 0x3f);
          uVar5 = uVar5 >> 7;
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x20);
        buf[3] = (uchar)(uVar4 >> 0x10);
        lVar3 = 0;
        uVar4 = 0;
        uVar5 = uVar2;
        do {
          uVar4 = uVar4 | (ulong)((uint)uVar5 & 0x7f) << ((byte)lVar3 & 0x3f);
          uVar5 = uVar5 >> 7;
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x20);
        buf[4] = (uchar)(uVar4 >> 8);
        lVar3 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 | (ulong)((uint)uVar2 & 0x7f) << ((byte)lVar3 & 0x3f);
          uVar2 = uVar2 >> 7;
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x20);
        __dest_00 = buf + 10;
        buf[5] = (uchar)uVar5;
        buf[6] = encoding;
        *(undefined2 *)(buf + 7) = *(undefined2 *)pcVar8;
        buf[9] = pcVar8[2];
        if (short_comment != (char *)0x0) {
          memcpy(__dest_00,short_comment,sVar6 & 0xffffffff);
          __dest_00 = __dest_00 + (sVar6 & 0xffffffff);
        }
        __dest = __dest_00 + 1;
        *__dest_00 = '\0';
        if (long_comment != (char *)0x0) {
          memcpy(__dest,long_comment,sVar1 & 0xffffffff);
          __dest = __dest + (sVar1 & 0xffffffff);
        }
        *__dest = '\0';
        return uVar7;
      }
    }
    return 0;
  }
  __assert_fail("len > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x23
                ,
                "unsigned int id3_fill_comment(unsigned char *, unsigned int, unsigned char, char *, char *, char *)"
               );
}

Assistant:

unsigned int id3_fill_comment(unsigned char *buf, unsigned int len,
                              unsigned char encoding,
                              char *short_comment,
                              char *long_comment,
                              char *language) {
  assert(buf != NULL);
  assert(len > 0);
  if ((short_comment == NULL) &&
      (long_comment == NULL))
    return 0;
  if (language == NULL)
    language = "eng";

  unsigned int short_len = short_comment ? strlen(short_comment) : 0;
  unsigned int long_len  = long_comment  ? strlen(long_comment)  : 0;
  
  unsigned char *ptr = buf;
  unsigned int flen = 1 + 3 + short_len + 1 + long_len + 1;
  if (len < 6 + flen)
    return 0;
  memcpy(ptr, "COM", 3); ptr += 3;
  UINT24_PACK(ptr, id3_sync_safe(flen));
  UINT8_PACK(ptr, encoding);
  memcpy(ptr, language, 3); ptr += 3;
  if (short_comment) {
    memcpy(ptr, short_comment, short_len);
    ptr += short_len;
  }
  UINT8_PACK(ptr, 0x00);
  if (long_comment) {
    memcpy(ptr, long_comment, long_len);
    ptr += long_len;
  }
  UINT8_PACK(ptr, 0x00);

  return 6 + flen;
}